

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_bin
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  char cVar1;
  uint uVar2;
  undefined1 n [16];
  string_view prefix;
  int num_digits_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_RDI;
  size_t unaff_retaddr;
  buffer_appender<char> in_stack_00000008;
  anon_class_16_2_cb75083a_for_f_conflict1 in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  basic_format_specs<char> *in_stack_ffffffffffffffe8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar4;
  
  if ((char)*(undefined1 *)((long)&(in_RDI[2].container)->ptr_ + 1) < '\0') {
    uVar2 = *(uint *)((long)(in_RDI + 6) + 4);
    *(uint *)((long)(in_RDI + 6) + 4) = uVar2 + 1;
    *(char *)((long)(in_RDI + 6) + (ulong)uVar2) = '0';
    cVar1 = *(char *)&(in_RDI[2].container)->ptr_;
    uVar2 = *(uint *)((long)(in_RDI + 6) + 4);
    *(uint *)((long)(in_RDI + 6) + 4) = uVar2 + 1;
    *(char *)((long)(in_RDI + 6) + (ulong)uVar2) = cVar1;
  }
  n._8_8_ = in_stack_ffffffffffffff90;
  n._0_8_ = in_stack_ffffffffffffff88;
  pbVar4 = in_RDI;
  num_digits_00 =
       count_digits<1u,unsigned__int128>((detail *)in_RDI[4].container,(unsigned___int128)n);
  get_prefix((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)0x28ef74
            );
  prefix.size_ = unaff_retaddr;
  prefix.data_ = (char *)pbVar4;
  bVar3.container =
       (buffer<char> *)
       write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_bin()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                 (in_stack_00000008,num_digits_00,prefix,in_stack_ffffffffffffffe8,in_stack_00000020
                 );
  in_RDI->container = bVar3.container;
  return;
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }